

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_setmetatable(lua_State *L)

{
  Node *pNVar1;
  int iVar2;
  TValue *pTVar3;
  StkId pTVar4;
  StkId pTVar5;
  int objindex;
  
  pTVar3 = L->base + 1;
  iVar2 = -1;
  if (pTVar3 != &luaO_nilobject_ && pTVar3 < L->top) {
    iVar2 = L->base[1].tt;
  }
  objindex = 1;
  luaL_checktype(L,1,5);
  if ((iVar2 != 0) && (iVar2 != 5)) {
    luaL_argerror(L,2,"nil or table expected");
  }
  iVar2 = lua_getmetatable(L,objindex);
  if (iVar2 != 0) {
    lua_pushlstring(L,"__metatable",0xb);
    pTVar5 = L->top;
    pTVar3 = luaH_get(&(pTVar5[-2].value.gc)->h,pTVar5 + -1);
    pTVar5[-1].value = pTVar3->value;
    pTVar5[-1].tt = pTVar3->tt;
    pNVar1 = (Node *)L->top;
    if ((pNVar1 == &dummynode_) || (*(int *)((long)&pNVar1[-1].i_key + 0x10) != 0)) {
      lua_remove(L,-2);
      luaL_error(L,"cannot change a protected metatable");
    }
    L->top = (StkId)&pNVar1[-1].i_val.tt;
  }
  pTVar5 = L->top;
  pTVar4 = L->base + 2;
  if (pTVar5 < pTVar4) {
    do {
      pTVar5->tt = 0;
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 < pTVar4);
    L->top = pTVar5;
  }
  L->top = pTVar4;
  lua_setmetatable(L,1);
  return 1;
}

Assistant:

static int luaB_setmetatable(lua_State*L){
int t=lua_type(L,2);
luaL_checktype(L,1,5);
luaL_argcheck(L,t==0||t==5,2,
"nil or table expected");
if(luaL_getmetafield(L,1,"__metatable"))
luaL_error(L,"cannot change a protected metatable");
lua_settop(L,2);
lua_setmetatable(L,1);
return 1;
}